

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O3

locale __thiscall
booster::locale::impl_posix::create_formatting_impl<char>
          (impl_posix *this,locale *in,shared_ptr<__locale_struct_*> *lc)

{
  element_type *pp_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  num_punct_posix<char> *this_00;
  ctype_posix<char> *__f;
  time_put_posix<char> *__f_00;
  num_format<char> *__f_01;
  bool bVar3;
  locale local_40;
  element_type *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  this_00 = (num_punct_posix<char> *)operator_new(0x78);
  num_punct_posix<char>::num_punct_posix
            (this_00,*(lc->super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
             ,0);
  std::locale::locale<booster::locale::impl_posix::num_punct_posix<char>>((locale *)this,in,this_00)
  ;
  __f = (ctype_posix<char> *)operator_new(0x250);
  local_38 = (lc->super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_30._M_pi =
       (lc->super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_30._M_pi)->_M_use_count = (local_30._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_30._M_pi)->_M_use_count = (local_30._M_pi)->_M_use_count + 1;
    }
  }
  std::ctype<char>::ctype((ushort *)__f,false,0);
  *(undefined ***)__f = &PTR__ctype_posix_001d1860;
  (__f->lc_).super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__f->lc_).super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_38;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(__f->lc_).super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&local_30);
  std::locale::locale<booster::locale::impl_posix::ctype_posix<char>>(&local_40,(locale *)this,__f);
  std::locale::operator=((locale *)this,&local_40);
  std::locale::~locale(&local_40);
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
  }
  __f_00 = (time_put_posix<char> *)operator_new(0x20);
  pp_Var1 = (lc->super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (lc->super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  if (p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    *(undefined4 *)&__f_00->field_0x8 = 0;
    *(undefined ***)__f_00 = &PTR__time_put_posix_001d18d8;
    (__f_00->lc_).super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pp_Var1
    ;
    (__f_00->lc_).super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
      bVar3 = __libc_single_threaded == '\0';
      *(undefined4 *)&__f_00->field_0x8 = 0;
      *(undefined ***)__f_00 = &PTR__time_put_posix_001d18d8;
      (__f_00->lc_).super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           pp_Var1;
      (__f_00->lc_).super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = p_Var2;
      if (bVar3) {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
        goto LAB_00199d05;
      }
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      *(undefined4 *)&__f_00->field_0x8 = 0;
      *(undefined ***)__f_00 = &PTR__time_put_posix_001d18d8;
      (__f_00->lc_).super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           pp_Var1;
      (__f_00->lc_).super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = p_Var2;
    }
    p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
  }
LAB_00199d05:
  std::locale::locale<booster::locale::impl_posix::time_put_posix<char>>
            (&local_40,(locale *)this,__f_00);
  std::locale::operator=((locale *)this,&local_40);
  std::locale::~locale(&local_40);
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  __f_01 = (num_format<char> *)operator_new(0x20);
  pp_Var1 = (lc->super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (lc->super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  if (p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    *(undefined4 *)&(__f_01->super_base_num_format<char>).field_0x8 = 0;
    *(undefined ***)&__f_01->super_base_num_format<char> = &PTR__num_format_001d1918;
    (__f_01->lc_).super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pp_Var1
    ;
    (__f_01->lc_).super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
      bVar3 = __libc_single_threaded == '\0';
      *(undefined4 *)&(__f_01->super_base_num_format<char>).field_0x8 = 0;
      *(undefined ***)&__f_01->super_base_num_format<char> = &PTR__num_format_001d1918;
      (__f_01->lc_).super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           pp_Var1;
      (__f_01->lc_).super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = p_Var2;
      if (bVar3) {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
        goto LAB_00199dcd;
      }
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      *(undefined4 *)&(__f_01->super_base_num_format<char>).field_0x8 = 0;
      *(undefined ***)&__f_01->super_base_num_format<char> = &PTR__num_format_001d1918;
      (__f_01->lc_).super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           pp_Var1;
      (__f_01->lc_).super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = p_Var2;
    }
    p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
  }
LAB_00199dcd:
  std::locale::locale<booster::locale::impl_posix::num_format<char>>
            (&local_40,(locale *)this,__f_01);
  std::locale::operator=((locale *)this,&local_40);
  std::locale::~locale(&local_40);
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  return (locale)(_Impl *)this;
}

Assistant:

std::locale create_formatting_impl(std::locale const &in,booster::shared_ptr<locale_t> lc)
{
    std::locale tmp = std::locale(in,new num_punct_posix<CharType>(*lc));
    tmp = std::locale(tmp,new ctype_posix<CharType>(lc));
    tmp = std::locale(tmp,new time_put_posix<CharType>(lc));
    tmp = std::locale(tmp,new num_format<CharType>(lc));
    return tmp;
}